

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineStateGLImpl.cpp
# Opt level: O2

void __thiscall
Diligent::PipelineStateGLImpl::
DvpVerifySRBResources(std::array<Diligent::ShaderResourceCacheGL*,8ul>const&,std::array<std::array<unsigned_short,4ul>,8ul>const&)
::RESOURCE_DIMENSION_bool_
          (void *this,GLResourceAttribs *Attribs,RESOURCE_DIMENSION ResDim,bool IsMS)

{
  ShaderResourceCacheGL *ResourceCache;
  bool bVar1;
  undefined8 *puVar2;
  char (*in_R8) [10];
  string msg;
  
  bVar1 = PipelineStateBase::ResourceAttribution::operator_cast_to_bool
                    (*(ResourceAttribution **)((long)this + 0x10));
  if (bVar1) {
    bVar1 = PipelineStateBase<Diligent::EngineGLImplTraits>::ResourceAttribution::IsImmutableSampler
                      (*(ResourceAttribution **)((long)this + 0x10));
    if (!bVar1) {
      puVar2 = *(undefined8 **)((long)this + 0x10);
      ResourceCache =
           *(ShaderResourceCacheGL **)(*(long *)((long)this + 8) + (ulong)*(uint *)(puVar2 + 1) * 8)
      ;
      if (ResourceCache == (ShaderResourceCacheGL *)0x0) {
        FormatString<char[25],unsigned_int,char[10]>
                  (&msg,(Diligent *)"Resource cache at index ",(char (*) [25])(puVar2 + 1),
                   (uint *)0x2e3bc2,in_R8);
        DebugAssertionFailed
                  (msg._M_dataplus._M_p,"Validate",
                   "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineOpenGL/src/PipelineStateGLImpl.cpp"
                   ,0x303);
        std::__cxx11::string::~string((string *)&msg);
        puVar2 = *(undefined8 **)((long)this + 0x10);
      }
      PipelineResourceSignatureGLImpl::DvpValidateCommittedResource
                ((PipelineResourceSignatureGLImpl *)*puVar2,Attribs,ResDim,IsMS,
                 *(Uint32 *)((long)puVar2 + 0xc),ResourceCache,
                 *(char **)(*(long *)(*this + 0xf8) + (ulong)**(uint **)((long)this + 0x18) * 0x20),
                 *(char **)(*this + 0x18));
    }
  }
  *(long *)((long)this + 0x10) = *(long *)((long)this + 0x10) + 0x18;
  return;
}

Assistant:

void Validate(const ShaderResourcesGL::GLResourceAttribs& Attribs, RESOURCE_DIMENSION ResDim, bool IsMS)
        {
            if (*attrib_it && !attrib_it->IsImmutableSampler())
            {
                const auto* pResourceCache = ResourceCaches[attrib_it->SignatureIndex];
                DEV_CHECK_ERR(pResourceCache != nullptr, "Resource cache at index ", attrib_it->SignatureIndex, " is null.");
                attrib_it->pSignature->DvpValidateCommittedResource(Attribs, ResDim, IsMS, attrib_it->ResourceIndex, *pResourceCache,
                                                                    PSO.m_ShaderNames[shader_ind].c_str(), PSO.m_Desc.Name);
            }
            ++attrib_it;
        }